

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.c
# Opt level: O3

void oonf_log_stderr(oonf_log_handler_entry *entry,oonf_log_parameters *param)

{
  char *pcVar1;
  
  pcVar1 = (char *)entry->custom;
  if (pcVar1 == (char *)0x0) {
    oonf_log_stderr_cold_3();
  }
  else {
    if ((*pcVar1 == '\x01') &&
       ((param->severity == LOG_SEVERITY_INFO || (param->severity == LOG_SEVERITY_WARN)))) {
      oonf_log_stderr_cold_1();
    }
    fputs(param->buffer,_stderr);
    fputc(10,_stderr);
    if ((*pcVar1 == '\x01') && (param->severity != LOG_SEVERITY_DEBUG)) {
      oonf_log_stderr_cold_2();
    }
  }
  return;
}

Assistant:

void
oonf_log_stderr(struct oonf_log_handler_entry *entry, struct oonf_log_parameters *param) {
  bool *color = entry->custom;

  if (color && *color) {
    switch (param->severity) {
      case LOG_SEVERITY_INFO:
        fputs("\033[0;33m", stderr);
        break;
      case LOG_SEVERITY_WARN:
        fputs("\033[0;31m", stderr);
        break;
      default:
        break;
    }
  }
  fputs(param->buffer, stderr);
  fputc('\n', stderr);
  if (color && *color && param->severity != LOG_SEVERITY_DEBUG) {
    fputs("\033[0m", stderr);
  }
}